

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne.h
# Opt level: O0

uint __thiscall FastPForLib::ZRandom::getValue(ZRandom *this)

{
  int iVar1;
  uint uVar2;
  uint y;
  uint v;
  uint y_1;
  int i;
  ZRandom *this_local;
  
  if (this->nValues == 0) {
    this->MT[0x270] = this->MT[0];
    for (i = 0; i < 0x270; i = i + 1) {
      v = *this->map[i] ^ (this->MT[i] & 0x80000000 | this->MT[i + 1] & 0x7fffffff) >> 1;
      if ((this->MT[i + 1] & 1) != 0) {
        v = v ^ 0x9908b0df;
      }
      this->MT[i] = v;
    }
    this->nValues = 0x270;
  }
  iVar1 = this->nValues;
  this->nValues = iVar1 + -1;
  uVar2 = this->MT[0x270 - iVar1] >> 0xb ^ this->MT[0x270 - iVar1];
  uVar2 = (uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = (uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

unsigned int ZRandom::getValue() {
  if (0 == nValues) {
    MT[N] = MT[0];
    for (int i = 0; i < N; ++i) {
      unsigned y = (0x80000000 & MT[i]) | (0x7FFFFFFF & MT[i + 1]);
      unsigned v = *(map[i]) ^ (y >> 1);
      if (1 & y)
        v ^= 2567483615;
      MT[i] = v;
    }
    nValues = N;
  }
  unsigned y = MT[N - nValues--];
  y ^= y >> 11;
  y ^= (y << 7) & 2636928640U;
  y ^= (y << 15) & 4022730752U;
  y ^= y >> 18;
  return y;
}